

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

int CVmObjBigNum::radix_from_string(char *str,size_t len)

{
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  utf8_ptr p;
  size_t rem;
  
  p.p_ = str;
  rem = len;
  while( true ) {
    if (rem == 0) goto LAB_002621f4;
    wVar1 = utf8_ptr::s_getch(p.p_);
    iVar2 = is_space(wVar1);
    if (iVar2 == 0) break;
    utf8_ptr::inc(&p,&rem);
  }
  if (rem == 0) goto LAB_002621f4;
  wVar1 = utf8_ptr::s_getch(p.p_);
  if ((wVar1 != L'-') && (wVar1 = utf8_ptr::s_getch(p.p_), wVar1 != L'+')) goto LAB_002621f4;
  do {
    utf8_ptr::inc(&p,&rem);
LAB_002621f4:
    if (rem == 0) {
      return 10;
    }
    wVar1 = utf8_ptr::s_getch(p.p_);
    iVar2 = is_space(wVar1);
  } while (iVar2 != 0);
  if ((rem != 0) && (wVar1 = utf8_ptr::s_getch(p.p_), wVar1 == L'0')) {
    utf8_ptr::inc(&p,&rem);
    if (rem != 0) {
      wVar1 = utf8_ptr::s_getch(p.p_);
      if (wVar1 == L'x') {
        return 0x10;
      }
      wVar1 = utf8_ptr::s_getch(p.p_);
      if (wVar1 == L'X') {
        return 0x10;
      }
    }
    while( true ) {
      if (rem == 0) {
        return 8;
      }
      wVar1 = utf8_ptr::s_getch(p.p_);
      uVar3 = wVar1 + L'\xffffffd2';
      if (0x37 < uVar3) {
        return 8;
      }
      if ((0x3fcUL >> ((ulong)uVar3 & 0x3f) & 1) == 0) break;
      utf8_ptr::inc(&p,&rem);
    }
    if ((0x80000000800c01U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      return 8;
    }
  }
  return 10;
}

Assistant:

int CVmObjBigNum::radix_from_string(const char *str, size_t len)
{
    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* skip the sign if present */
    if (rem != 0 && (p.getch() == '-' || p.getch() == '+'))
        p.inc(&rem);

    /* skip more spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a radix indicator */
    if (rem != 0 && p.getch() == '0')
    {
        /*
         *   There's a leading zero, so it could be hex or octal.  If there's
         *   an 'x', it's definitely hex.  Otherwise, it's octal as long as
         *   it's in purely integer format - that is, no decimal point or 'E'
         *   exponent marker.
         */
        p.inc(&rem);
        if (rem != 0 && (p.getch() == 'x' || p.getch() == 'X'))
        {
            /* 0x prefix, so it's definitely hex */
            return 16;
        }

        /* 
         *   There's a leading 0 but no 'x', so it could be octal or decimal,
         *   depending on what's in the rest of the string. 
         */
        for ( ; rem != 0 ; p.inc(&rem))
        {
            switch (p.getch())
            {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
                /* octal digit, so we can't rule anything out yet */
                continue;

            case '.':
            case 'e':
            case 'E':
                /* 
                 *   decimal point or exponent marker, so it's a floating
                 *   point value, which can only be decimal 
                 */
                return 10;
                
            case '8':
            case '9':
                /* an 8 or a 9 can only appear in a decimal number */
                return 10;

            default:
                /* 
                 *   Anything else is invalid within a number, whether octal
                 *   integer or floating point, so we've reached the end of
                 *   the number.  Since we didn't encounter anything that
                 *   makes the number a floating point value or decimal
                 *   integer, we have an octal integer.
                 */
                return 8;
            }
        }

        /* 
         *   we reached the end of the number without finding anything that
         *   would rule out treating it as an octal integer, so that's what
         *   it is 
         */
        return 8;
    }
    else
    {
        /* no leading '0', so it's decimal */
        return 10;
    }
}